

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::ModeState<double,duckdb::ModeStandard<double>>,double,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  FunctionData *pFVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  double *pdVar9;
  double *key;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat sdata;
  ulong local_f8;
  AggregateUnaryInput local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    if (*states == (Vector)0x0) {
      key = *(double **)(input + 0x20);
      lVar2 = *(long *)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      if (*(long *)(input + 0x28) == 0) {
        if (count == 0) {
          return;
        }
        iVar7 = 0;
        do {
          BaseModeFunction<duckdb::ModeStandard<double>>::
          Execute<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                    (*(ModeState<double,_duckdb::ModeStandard<double>_> **)(lVar2 + iVar7 * 8),key,
                     aggr_input_data);
          iVar7 = iVar7 + 1;
          key = key + 1;
        } while (count != iVar7);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      local_f8 = 0;
      uVar5 = 0;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar3 = uVar5 + 0x40;
          if (count <= uVar5 + 0x40) {
            uVar3 = count;
          }
LAB_0056d5c0:
          uVar6 = uVar5;
          if (uVar5 < uVar3) {
            pdVar9 = key + uVar5;
            do {
              BaseModeFunction<duckdb::ModeStandard<double>>::
              Execute<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                        (*(ModeState<double,_duckdb::ModeStandard<double>_> **)(lVar2 + uVar5 * 8),
                         pdVar9,aggr_input_data);
              uVar5 = uVar5 + 1;
              pdVar9 = pdVar9 + 1;
              uVar6 = uVar3;
            } while (uVar3 != uVar5);
          }
        }
        else {
          uVar4 = *(ulong *)(*(long *)(input + 0x28) + local_f8 * 8);
          uVar3 = uVar5 + 0x40;
          if (count <= uVar5 + 0x40) {
            uVar3 = count;
          }
          if (uVar4 == 0xffffffffffffffff) goto LAB_0056d5c0;
          uVar6 = uVar3;
          if ((uVar4 != 0) && (uVar6 = uVar5, uVar5 < uVar3)) {
            pdVar9 = key + uVar5;
            uVar8 = 0;
            do {
              if ((uVar4 >> (uVar8 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<double>>::
                Execute<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                          (*(ModeState<double,_duckdb::ModeStandard<double>_> **)
                            (lVar2 + uVar5 * 8 + uVar8 * 8),pdVar9,aggr_input_data);
              }
              uVar8 = uVar8 + 1;
              pdVar9 = pdVar9 + 1;
              uVar6 = uVar3;
            } while (uVar3 - uVar5 != uVar8);
          }
        }
        local_f8 = local_f8 + 1;
        uVar5 = uVar6;
        if (local_f8 == count + 0x3f >> 6) {
          return;
        }
      } while( true );
    }
  }
  else if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
      return;
    }
    local_c0.input_mask = (ValidityMask *)(input + 0x28);
    local_c0.input_idx = 0;
    local_c0.input = aggr_input_data;
    TypedModeFunction<duckdb::ModeStandard<double>>::
    ConstantOperation<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
              ((ModeState<double,_duckdb::ModeStandard<double>_> *)**(undefined8 **)(states + 0x20),
               *(double **)(input + 0x20),&local_c0,count);
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  if (local_c0.input_idx == 0) {
    if (count != 0) {
      uVar5 = 0;
      do {
        pFVar1 = ((local_c0.input)->bind_data).ptr;
        uVar3 = uVar5;
        if (pFVar1 != (FunctionData *)0x0) {
          uVar3 = (ulong)*(uint *)(pFVar1 + uVar5 * 4);
        }
        uVar4 = uVar5;
        if (*local_78 != 0) {
          uVar4 = (ulong)*(uint *)(*local_78 + uVar5 * 4);
        }
        BaseModeFunction<duckdb::ModeStandard<double>>::
        Execute<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                  (*(ModeState<double,_duckdb::ModeStandard<double>_> **)(local_70 + uVar4 * 8),
                   (double *)
                   (&((local_c0.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_mask + uVar3),aggr_input_data);
        uVar5 = uVar5 + 1;
      } while (count != uVar5);
    }
  }
  else if (count != 0) {
    uVar5 = 0;
    do {
      pFVar1 = ((local_c0.input)->bind_data).ptr;
      uVar3 = uVar5;
      if (pFVar1 != (FunctionData *)0x0) {
        uVar3 = (ulong)*(uint *)(pFVar1 + uVar5 * 4);
      }
      uVar4 = uVar5;
      if (*local_78 != 0) {
        uVar4 = (ulong)*(uint *)(*local_78 + uVar5 * 4);
      }
      if ((local_c0.input_idx == 0) ||
         ((*(ulong *)(local_c0.input_idx + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) != 0)) {
        BaseModeFunction<duckdb::ModeStandard<double>>::
        Execute<double,duckdb::ModeState<double,duckdb::ModeStandard<double>>,duckdb::EntropyFunction<duckdb::ModeStandard<double>>>
                  (*(ModeState<double,_duckdb::ModeStandard<double>_> **)(local_70 + uVar4 * 8),
                   (double *)
                   (&((local_c0.input_mask)->super_TemplatedValidityMask<unsigned_long>).
                     validity_mask + uVar3),aggr_input_data);
      }
      uVar5 = uVar5 + 1;
    } while (count != uVar5);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}